

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O1

void highbd_masked_variance
               (uint16_t *src_ptr,int src_stride,uint16_t *a_ptr,int a_stride,uint16_t *b_ptr,
               int b_stride,uint8_t *m_ptr,int m_stride,int width,int height,uint64_t *sse,int *sum_
               )

{
  uint16_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  unkuint9 Var15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [14];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  long lVar20;
  int iVar21;
  int iVar23;
  int iVar24;
  undefined1 auVar22 [16];
  int iVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  ushort uVar33;
  undefined1 uVar38;
  short sVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  
  if (height < 1) {
    auVar22 = (undefined1  [16])0x0;
    lVar26 = 0;
    lVar32 = 0;
  }
  else {
    auVar22 = (undefined1  [16])0x0;
    iVar21 = 0;
    lVar26 = 0;
    lVar32 = 0;
    do {
      if (0 < width) {
        lVar20 = 0;
        do {
          auVar30 = *(undefined1 (*) [16])(src_ptr + lVar20);
          auVar29 = *(undefined1 (*) [16])(a_ptr + lVar20);
          puVar1 = b_ptr + lVar20;
          uVar2 = *(ulong *)(m_ptr + lVar20);
          uVar38 = (undefined1)(uVar2 >> 0x38);
          auVar3._8_6_ = 0;
          auVar3._0_8_ = uVar2;
          auVar3[0xe] = uVar38;
          auVar5._8_4_ = 0;
          auVar5._0_8_ = uVar2;
          auVar5[0xc] = (char)(uVar2 >> 0x30);
          auVar5._13_2_ = auVar3._13_2_;
          auVar7._8_4_ = 0;
          auVar7._0_8_ = uVar2;
          auVar7._12_3_ = auVar5._12_3_;
          auVar8._8_2_ = 0;
          auVar8._0_8_ = uVar2;
          auVar8[10] = (char)(uVar2 >> 0x28);
          auVar8._11_4_ = auVar7._11_4_;
          auVar10._8_2_ = 0;
          auVar10._0_8_ = uVar2;
          auVar10._10_5_ = auVar8._10_5_;
          auVar11[8] = (char)(uVar2 >> 0x20);
          auVar11._0_8_ = uVar2;
          auVar11._9_6_ = auVar10._9_6_;
          auVar14._7_8_ = 0;
          auVar14._0_7_ = auVar11._8_7_;
          Var15 = CONCAT81(SUB158(auVar14 << 0x40,7),(char)(uVar2 >> 0x18));
          auVar18._9_6_ = 0;
          auVar18._0_9_ = Var15;
          auVar16._1_10_ = SUB1510(auVar18 << 0x30,5);
          auVar16[0] = (char)(uVar2 >> 0x10);
          auVar19._11_4_ = 0;
          auVar19._0_11_ = auVar16;
          uVar33 = (ushort)uVar2;
          auVar12[2] = (char)(uVar2 >> 8);
          auVar12._0_2_ = uVar33;
          auVar12._3_12_ = SUB1512(auVar19 << 0x20,3);
          auVar13._2_13_ = auVar12._2_13_;
          auVar13._0_2_ = uVar33 & 0xff;
          sVar37 = (short)Var15;
          auVar44._0_12_ = auVar29._0_12_;
          auVar44._12_2_ = auVar29._6_2_;
          auVar44._14_2_ = puVar1[3];
          auVar43._12_4_ = auVar44._12_4_;
          auVar43._0_10_ = auVar29._0_10_;
          auVar43._10_2_ = puVar1[2];
          auVar42._10_6_ = auVar43._10_6_;
          auVar42._0_8_ = auVar29._0_8_;
          auVar42._8_2_ = auVar29._4_2_;
          auVar41._8_8_ = auVar42._8_8_;
          auVar41._6_2_ = puVar1[1];
          auVar41._4_2_ = auVar29._2_2_;
          auVar41._0_2_ = auVar29._0_2_;
          auVar41._2_2_ = *puVar1;
          auVar27._0_12_ = auVar13._0_12_;
          auVar27._12_2_ = sVar37;
          auVar27._14_2_ = 0x40 - sVar37;
          auVar35._12_4_ = auVar27._12_4_;
          auVar35._0_10_ = auVar13._0_10_;
          auVar35._10_2_ = 0x40 - auVar16._0_2_;
          auVar28._10_6_ = auVar35._10_6_;
          auVar28._8_2_ = auVar16._0_2_;
          auVar28._6_2_ = 0x40 - auVar12._2_2_;
          auVar28._4_2_ = auVar12._2_2_;
          auVar28._0_4_ = CONCAT22(0x40 - (uVar33 & 0xff),uVar33) & 0xffff00ff;
          auVar28 = pmaddwd(auVar28,auVar41);
          auVar40._2_2_ = puVar1[4];
          auVar40._0_2_ = auVar29._8_2_;
          auVar40._4_2_ = auVar29._10_2_;
          auVar40._6_2_ = puVar1[5];
          auVar40._8_2_ = auVar29._12_2_;
          auVar40._10_2_ = puVar1[6];
          auVar40._12_2_ = auVar29._14_2_;
          auVar40._14_2_ = puVar1[7];
          auVar34._2_2_ = 0x40 - auVar11._8_2_;
          auVar34._0_2_ = auVar11._8_2_;
          auVar34._4_2_ = auVar8._10_2_;
          auVar34._6_2_ = 0x40 - auVar8._10_2_;
          auVar34._8_2_ = auVar5._12_2_;
          auVar34._10_2_ = 0x40 - auVar5._12_2_;
          auVar34[0xc] = uVar38;
          auVar34[0xd] = 0;
          auVar34._14_2_ = 0x40 - (auVar3._13_2_ >> 8);
          auVar35 = pmaddwd(auVar34,auVar40);
          auVar4._10_2_ = 0;
          auVar4._0_10_ = auVar30._0_10_;
          auVar4._12_2_ = auVar30._6_2_;
          auVar6._8_2_ = auVar30._4_2_;
          auVar6._0_8_ = auVar30._0_8_;
          auVar6._10_4_ = auVar4._10_4_;
          auVar17._6_8_ = 0;
          auVar17._0_6_ = auVar6._8_6_;
          auVar9._4_2_ = auVar30._2_2_;
          auVar9._0_4_ = auVar30._0_4_;
          auVar9._6_8_ = SUB148(auVar17 << 0x40,6);
          auVar29._0_4_ = (auVar28._0_4_ + 0x20 >> 6) - (auVar30._0_4_ & 0xffff);
          auVar29._4_4_ = (auVar28._4_4_ + 0x20 >> 6) - auVar9._4_4_;
          auVar29._8_4_ = (auVar28._8_4_ + 0x20 >> 6) - auVar6._8_4_;
          auVar29._12_4_ = (auVar28._12_4_ + 0x20 >> 6) - (auVar4._10_4_ >> 0x10);
          auVar36._0_4_ = (auVar35._0_4_ + 0x20 >> 6) - (uint)auVar30._8_2_;
          auVar36._4_4_ = (auVar35._4_4_ + 0x20 >> 6) - (uint)auVar30._10_2_;
          auVar36._8_4_ = (auVar35._8_4_ + 0x20 >> 6) - (uint)auVar30._12_2_;
          auVar36._12_4_ = (auVar35._12_4_ + 0x20 >> 6) - (uint)auVar30._14_2_;
          iVar23 = auVar22._4_4_;
          iVar24 = auVar22._8_4_;
          iVar25 = auVar22._12_4_;
          auVar22._0_4_ = auVar22._0_4_ + auVar29._0_4_ + auVar36._0_4_;
          auVar22._4_4_ = iVar23 + auVar29._4_4_ + auVar36._4_4_;
          auVar22._8_4_ = iVar24 + auVar29._8_4_ + auVar36._8_4_;
          auVar22._12_4_ = iVar25 + auVar29._12_4_ + auVar36._12_4_;
          auVar30 = packssdw(auVar29,auVar36);
          auVar30 = pmaddwd(auVar30,auVar30);
          auVar39._0_8_ = auVar30._0_8_;
          auVar39._8_4_ = auVar30._4_4_;
          auVar39._12_4_ = auVar30._4_4_ >> 0x1f;
          auVar31._0_8_ = (long)auVar30._8_4_;
          auVar31._8_4_ = auVar30._12_4_;
          auVar31._12_4_ = auVar30._12_4_ >> 0x1f;
          lVar26 = auVar31._0_8_ + lVar26 + (long)auVar30._0_4_;
          lVar32 = auVar31._8_8_ + lVar32 + auVar39._8_8_;
          lVar20 = lVar20 + 8;
        } while (lVar20 < width);
      }
      m_ptr = m_ptr + m_stride;
      iVar21 = iVar21 + 1;
      b_ptr = b_ptr + (uint)b_stride;
      a_ptr = a_ptr + (uint)a_stride;
      src_ptr = src_ptr + src_stride;
    } while (iVar21 != height);
  }
  auVar22 = phaddd(auVar22,auVar22);
  auVar22 = phaddd(auVar22,auVar22);
  *sum_ = auVar22._0_4_;
  *sse = lVar32 + lVar26;
  return;
}

Assistant:

static void highbd_masked_variance(const uint16_t *src_ptr, int src_stride,
                                   const uint16_t *a_ptr, int a_stride,
                                   const uint16_t *b_ptr, int b_stride,
                                   const uint8_t *m_ptr, int m_stride,
                                   int width, int height, uint64_t *sse,
                                   int *sum_) {
  int x, y;
  // Note on bit widths:
  // The maximum value of 'sum' is (2^12 - 1) * 128 * 128 =~ 2^26,
  // so this can be kept as four 32-bit values.
  // But the maximum value of 'sum_sq' is (2^12 - 1)^2 * 128 * 128 =~ 2^38,
  // so this must be stored as two 64-bit values.
  __m128i sum = _mm_setzero_si128(), sum_sq = _mm_setzero_si128();
  const __m128i mask_max = _mm_set1_epi16((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i round_const =
      _mm_set1_epi32((1 << AOM_BLEND_A64_ROUND_BITS) >> 1);
  const __m128i zero = _mm_setzero_si128();

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x += 8) {
      const __m128i src = _mm_loadu_si128((const __m128i *)&src_ptr[x]);
      const __m128i a = _mm_loadu_si128((const __m128i *)&a_ptr[x]);
      const __m128i b = _mm_loadu_si128((const __m128i *)&b_ptr[x]);
      const __m128i m =
          _mm_unpacklo_epi8(_mm_loadl_epi64((const __m128i *)&m_ptr[x]), zero);
      const __m128i m_inv = _mm_sub_epi16(mask_max, m);

      // Calculate 8 predicted pixels.
      const __m128i data_l = _mm_unpacklo_epi16(a, b);
      const __m128i mask_l = _mm_unpacklo_epi16(m, m_inv);
      __m128i pred_l = _mm_madd_epi16(data_l, mask_l);
      pred_l = _mm_srai_epi32(_mm_add_epi32(pred_l, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      const __m128i data_r = _mm_unpackhi_epi16(a, b);
      const __m128i mask_r = _mm_unpackhi_epi16(m, m_inv);
      __m128i pred_r = _mm_madd_epi16(data_r, mask_r);
      pred_r = _mm_srai_epi32(_mm_add_epi32(pred_r, round_const),
                              AOM_BLEND_A64_ROUND_BITS);

      const __m128i src_l = _mm_unpacklo_epi16(src, zero);
      const __m128i src_r = _mm_unpackhi_epi16(src, zero);
      __m128i diff_l = _mm_sub_epi32(pred_l, src_l);
      __m128i diff_r = _mm_sub_epi32(pred_r, src_r);

      // Update partial sums and partial sums of squares
      sum = _mm_add_epi32(sum, _mm_add_epi32(diff_l, diff_r));
      // A trick: Now each entry of diff_l and diff_r is stored in a 32-bit
      // field, but the range of values is only [-(2^12 - 1), 2^12 - 1].
      // So we can re-pack into 16-bit fields and use _mm_madd_epi16
      // to calculate the squares and partially sum them.
      const __m128i tmp = _mm_packs_epi32(diff_l, diff_r);
      const __m128i prod = _mm_madd_epi16(tmp, tmp);
      // Then we want to sign-extend to 64 bits and accumulate
      const __m128i sign = _mm_srai_epi32(prod, 31);
      const __m128i tmp_0 = _mm_unpacklo_epi32(prod, sign);
      const __m128i tmp_1 = _mm_unpackhi_epi32(prod, sign);
      sum_sq = _mm_add_epi64(sum_sq, _mm_add_epi64(tmp_0, tmp_1));
    }

    src_ptr += src_stride;
    a_ptr += a_stride;
    b_ptr += b_stride;
    m_ptr += m_stride;
  }
  // Reduce down to a single sum and sum of squares
  sum = _mm_hadd_epi32(sum, zero);
  sum = _mm_hadd_epi32(sum, zero);
  *sum_ = _mm_cvtsi128_si32(sum);
  sum_sq = _mm_add_epi64(sum_sq, _mm_srli_si128(sum_sq, 8));
  _mm_storel_epi64((__m128i *)sse, sum_sq);
}